

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifCut.c
# Opt level: O0

int If_CutGetCutMinLevel(If_Man_t *p,If_Cut_t *pCut)

{
  bool bVar1;
  uint local_30;
  uint local_28;
  int local_24;
  int nMinLevel;
  int i;
  If_Obj_t *pLeaf;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  local_28 = 100000000;
  local_24 = 0;
  while( true ) {
    bVar1 = false;
    if (local_24 < (int)(*(uint *)&pCut->field_0x1c >> 0x18)) {
      _nMinLevel = If_ManObj(p,(int)(&pCut[1].Area)[local_24]);
      bVar1 = _nMinLevel != (If_Obj_t *)0x0;
    }
    if (!bVar1) break;
    if (local_28 < *(uint *)_nMinLevel >> 0xd) {
      local_30 = local_28;
    }
    else {
      local_30 = *(uint *)_nMinLevel >> 0xd;
    }
    local_28 = local_30;
    local_24 = local_24 + 1;
  }
  return local_28;
}

Assistant:

int If_CutGetCutMinLevel( If_Man_t * p, If_Cut_t * pCut )
{
    If_Obj_t * pLeaf;
    int i, nMinLevel = IF_INFINITY;
    If_CutForEachLeaf( p, pCut, pLeaf, i )
        nMinLevel = IF_MIN( nMinLevel, (int)pLeaf->Level );
    return nMinLevel;
}